

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP3Deserializer::ParsePGIndex
          (BP3Deserializer *this,BufferSTL *bufferSTL,string *hostLanguage)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  unsigned_long uVar5;
  string *in_RDX;
  long *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar6;
  ProcessGroupIndex index;
  size_t pgIndexLength;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  stepsFound;
  size_t localPosition;
  size_t position;
  vector<char,_std::allocator<char>_> *buffer;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  _Node_iterator_base<unsigned_int,_false> in_stack_fffffffffffffec8;
  string local_120 [32];
  _Node_iterator_base<unsigned_int,_false> local_100;
  undefined1 local_f8;
  undefined1 in_stack_ffffffffffffff17;
  size_t *in_stack_ffffffffffffff18;
  _Node_iterator_base<unsigned_int,_false> in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff29;
  int local_c8;
  ushort local_c0;
  char local_78;
  ulong local_30;
  
  uVar5 = helper::ReadValue<unsigned_long>
                    ((vector<char,_std::allocator<char>_> *)in_RDX,
                     (size_t *)in_stack_fffffffffffffec8._M_cur,
                     SUB41((uint)in_stack_fffffffffffffec4 >> 0x18,0));
  *(unsigned_long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a0) = uVar5;
  helper::ReadValue<unsigned_long>
            ((vector<char,_std::allocator<char>_> *)in_RDX,
             (size_t *)in_stack_fffffffffffffec8._M_cur,
             SUB41((uint)in_stack_fffffffffffffec4 >> 0x18,0));
  local_30 = 0;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0xb73deb);
  *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d0) = 0;
  lVar1 = in_RDI[6];
  lVar2 = in_RDI[5];
  while (local_30 < (lVar1 - lVar2) - 0x10U) {
    BPBase::ReadProcessGroupIndexHeader
              ((BPBase *)CONCAT71(in_stack_ffffffffffffff29,in_stack_ffffffffffffff28),
               (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff20._M_cur,
               in_stack_ffffffffffffff18,(bool)in_stack_ffffffffffffff17);
    if (local_78 == 'y') {
      *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x2f0) = 0;
    }
    *(ulong *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d8) = (ulong)(local_c8 - 1);
    pVar6 = std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::insert((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)in_RDX,(value_type *)in_stack_fffffffffffffec8._M_cur);
    in_stack_fffffffffffffec8._M_cur =
         (__node_type *)pVar6.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
    local_f8 = pVar6.second;
    in_stack_fffffffffffffec4 = CONCAT13(local_f8,(int3)in_stack_fffffffffffffec4);
    if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d0) =
           *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1d0) + 1;
    }
    local_30 = (long)(int)(local_c0 + 2) + local_30;
    local_100._M_cur = in_stack_fffffffffffffec8._M_cur;
    in_stack_ffffffffffffff20._M_cur = in_stack_fffffffffffffec8._M_cur;
    in_stack_ffffffffffffff28 = local_f8;
    BPBase::ProcessGroupIndex::~ProcessGroupIndex
              ((ProcessGroupIndex *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  }
  uVar4 = *(byte *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x2f0) & 1;
  std::__cxx11::string::string(local_120,(string *)in_RDX);
  bVar3 = helper::IsRowMajor(in_RDX);
  std::__cxx11::string::~string(local_120);
  if (uVar4 != bVar3) {
    *(undefined1 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x2f1) = 1;
  }
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)0xb73fdd);
  return;
}

Assistant:

void BP3Deserializer::ParsePGIndex(const BufferSTL &bufferSTL, const std::string hostLanguage)
{
    const auto &buffer = bufferSTL.m_Buffer;
    // always start from zero
    size_t position = 0;

    m_MetadataSet.DataPGCount =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    size_t localPosition = 0;

    std::unordered_set<uint32_t> stepsFound;
    m_MetadataSet.StepsCount = 0;

    /* Note: In ADIOS 1.x BP3 files, length is unreliable and is
     * probably smaller than the actual length of the PG index. Let's use
     * here the more reliable limit: the start of variable index - start of
     * PG index (- the already parsed 16 bytes)
     */
    const size_t pgIndexLength = m_Minifooter.VarsIndexStart - m_Minifooter.PGIndexStart - 16;

    while (localPosition < pgIndexLength)
    {
        ProcessGroupIndex index =
            ReadProcessGroupIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);
        if (index.IsColumnMajor == 'y')
        {
            m_IsRowMajor = false;
        }

        m_MetadataSet.CurrentStep = static_cast<size_t>(index.Step - 1);

        // Count the number of unseen steps
        if (stepsFound.insert(index.Step).second)
        {
            ++m_MetadataSet.StepsCount;
        }

        localPosition += index.Length + 2;
    }

    if (m_IsRowMajor != helper::IsRowMajor(hostLanguage))
    {
        m_ReverseDimensions = true;
    }
}